

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

ssize_t __thiscall
capnp::
Request<capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>
::send(Request<capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>
       *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 *puVar1;
  PipelineHook *pPVar2;
  PipelineOp *pPVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  RemotePromise<capnp::AnyPointer> local_68;
  Pipeline local_38;
  
  puVar1 = *(undefined8 **)(CONCAT44(in_register_00000034,__fd) + 0x30);
  (**(code **)*puVar1)(&local_68,puVar1);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(CONCAT44(in_register_00000034,__fd) + 0x28)
            );
  kj::Promise<capnp::Response<capnp::AnyPointer>>::
  then<capnp::Request<capnproto_test::capnp::test::TestInterface::GetTestTailCallerParams,capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>
            ((Promise<capnp::Response<capnp::AnyPointer>> *)&local_70,
             (anon_class_1_0_00000001_for_func *)&local_68);
  sVar4 = local_68.super_Pipeline.ops.size_;
  pPVar3 = local_68.super_Pipeline.ops.ptr;
  pPVar2 = local_68.super_Pipeline.hook.ptr;
  local_38.hook.disposer = local_68.super_Pipeline.hook.disposer;
  local_68.super_Pipeline.hook.ptr = (PipelineHook *)0x0;
  local_38.ops.disposer = local_68.super_Pipeline.ops.disposer;
  local_68.super_Pipeline.ops.ptr = (PipelineOp *)0x0;
  local_68.super_Pipeline.ops.size_ = 0;
  sVar5 = local_68.super_Pipeline.ops.size_;
  (this->super_Builder)._builder.segment = (SegmentBuilder *)local_70.ptr;
  local_70.ptr = (PromiseNode *)0x0;
  (this->super_Builder)._builder.capTable = (CapTableBuilder *)local_68.super_Pipeline.hook.disposer
  ;
  local_38.hook.ptr = (PipelineHook *)0x0;
  (this->super_Builder)._builder.data = pPVar2;
  (this->super_Builder)._builder.pointers = (WirePointer *)pPVar3;
  local_68.super_Pipeline.ops.size_._0_4_ = (undefined4)sVar4;
  local_68.super_Pipeline.ops.size_._4_2_ = SUB82(sVar4,4);
  local_68.super_Pipeline.ops.size_._6_2_ = SUB82(sVar4,6);
  (this->super_Builder)._builder.dataSize = (undefined4)local_68.super_Pipeline.ops.size_;
  (this->super_Builder)._builder.pointerCount = local_68.super_Pipeline.ops.size_._4_2_;
  *(undefined2 *)&(this->super_Builder)._builder.field_0x26 =
       local_68.super_Pipeline.ops.size_._6_2_;
  (this->hook).disposer = (Disposer *)local_68.super_Pipeline.ops.disposer;
  local_38.ops.ptr = (PipelineOp *)0x0;
  local_38.ops.size_ = 0;
  local_68.super_Pipeline.ops.size_ = sVar5;
  AnyPointer::Pipeline::~Pipeline(&local_38);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_68);
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}